

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src;
  uchar *sig;
  char *pcVar4;
  uchar *in_R8;
  size_t in_R9;
  tree ntree;
  string check_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48 [32];
  
  std::__cxx11::string::string((string *)&check_str,"",(allocator *)&ntree);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter Merkle Leafes: ");
  std::operator<<(poVar3,'\n');
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ntree.merkleRoot._M_dataplus._M_p = (pointer)0x0;
    ntree.merkleRoot._M_string_length._0_1_ = 0;
    ntree._vptr_tree = (_func_int **)&ntree.merkleRoot._M_string_length;
    std::operator>>((istream *)&std::cin,(string *)&ntree);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ntree,";");
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&v,(value_type *)&ntree);
    std::__cxx11::string::~string((string *)&ntree);
  }
  std::__cxx11::string::~string((string *)&ntree);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter Leaf to verify: ");
  std::operator<<(poVar3,'\n');
  std::operator>>((istream *)&std::cin,(string *)&check_str);
  picosha2::hash256_hex_string<std::__cxx11::string>((string *)&ntree,(picosha2 *)&check_str,src);
  std::__cxx11::string::operator=((string *)&check_str,(string *)&ntree);
  std::__cxx11::string::~string((string *)&ntree);
  tree::tree(&ntree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,&v);
  tree::buildBaseLeafes(&ntree,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  tree::buildTree(&ntree);
  poVar3 = std::operator<<((ostream *)&std::cout,"Check if: ");
  poVar3 = std::operator<<(poVar3,(string *)&check_str);
  poVar3 = std::operator<<(poVar3," is contained in tree");
  std::operator<<(poVar3,'\n');
  std::__cxx11::string::string(local_48,(string *)&check_str);
  iVar2 = tree::verify(&ntree,(EVP_PKEY_CTX *)local_48,sig,in_RCX,in_R8,in_R9);
  std::__cxx11::string::~string(local_48);
  pcVar4 = "All Clear";
  if (iVar2 == 0) {
    pcVar4 = "Nope something is wrong";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::operator<<(poVar3,'\n');
  tree::~tree(&ntree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  std::__cxx11::string::~string((string *)&check_str);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {


  string check_str = "";

  std::cout << "Enter Merkle Leafes: " << '\n';
  std::vector<string> v;

  while(1) {
    string str;
    std::cin >> str;
    if(str != ";")
      v.push_back(str);
    else
      break;
  }

  std::cout << "Enter Leaf to verify: " << '\n';

  cin >> check_str;

  check_str = picosha2::hash256_hex_string(check_str);


  tree ntree;

  ntree.buildBaseLeafes(v);
  ntree.buildTree();

  std::cout << "Check if: " << check_str << " is contained in tree" << '\n';

  if(ntree.verify(check_str)){
    std::cout << "All Clear" << '\n';
  } else {
      std::cout << "Nope something is wrong" << '\n';
  }



  return 0;
}